

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O3

void proc_ctu32(H265eSlice *slice,DataCu *cu)

{
  uint uVar1;
  RK_U32 RVar2;
  ulong uVar3;
  RK_U32 RVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = slice->m_sps->m_maxCUSize;
  RVar4 = cu->pixelX;
  RVar2 = cu->pixelY;
  uVar6 = 1 << ((char)slice->m_sps->m_maxCUDepth * '\x02' & 0x1fU);
  uVar3 = 0;
  do {
    cu->m_cuDepth[uVar3] = '\0';
    cu->m_cuSize[uVar3] = (RK_U8)uVar1;
    uVar3 = uVar3 + 1;
  } while (uVar6 != uVar3);
  if ((cu->tile_end_x < RVar4 + (uVar1 - 1)) || (cu->tile_end_y < (uVar1 - 1) + RVar2)) {
    uVar3 = 0;
    do {
      RVar4 = 0;
      if ((uVar3 & 1) != 0) {
        RVar4 = uVar1 >> 1;
      }
      proc_cu16(cu,RVar4,(int)(uVar3 >> 1) * (uVar1 >> 1),uVar6 >> 2,1,(int)uVar3);
      uVar5 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar5;
    } while (uVar5 != 4);
    uVar3 = 0;
    do {
      if (cu->m_cuDepth[uVar3] < 3) {
        cu->m_cuSize[uVar3] = (RK_U8)(0x81020 >> ((cu->m_cuDepth[uVar3] & 3) << 3));
      }
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  return;
}

Assistant:

static void proc_ctu32(H265eSlice *slice, DataCu *cu)
{
    H265eSps *sps = slice->m_sps;
    RK_U32 k, m;
    RK_U32 cu_x_1, cu_y_1;
    RK_U32 m_nCtuSize = sps->m_maxCUSize;
    RK_U32 lpelx = cu->pixelX;
    RK_U32 rpelx = lpelx + m_nCtuSize - 1;
    RK_U32 tpely = cu->pixelY;
    RK_U32 bpely = tpely + m_nCtuSize - 1;
    RK_U32 numPartions = 1 << (sps->m_maxCUDepth << 1);
    RK_S32 cuDepth = 0;

    for (k = 0; k < numPartions; k++) {
        cu->m_cuDepth[k] = 0;
        cu->m_cuSize[k] = m_nCtuSize;
    }
    if ((rpelx <= cu->tile_end_x) && (bpely <= cu->tile_end_y))
        return;

    for (m = 0; m < 4; m ++) {
        cu_x_1 = (m & 1) * (m_nCtuSize >> 1);
        cu_y_1 = (m >> 1) * (m_nCtuSize >> 1);
        proc_cu16(cu, cu_x_1, cu_y_1, numPartions / 4, cuDepth + 1, m);
    }

    for (k = 0; k < numPartions; k++) {
        switch (cu->m_cuDepth[k]) {
        case 0: cu->m_cuSize[k] = 32; break;
        case 1: cu->m_cuSize[k] = 16; break;
        case 2: cu->m_cuSize[k] = 8;  break;
        }
    }
}